

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtimer.cpp
# Opt level: O0

void testTimerRoutine(void)

{
  int local_11c;
  duration<long,_std::ratio<1L,_1L>_> local_118 [2];
  undefined1 local_108 [40];
  undefined1 local_e0 [24];
  TimerRoutine routine;
  
  hwnet::util::TimerRoutine::TimerRoutine((TimerRoutine *)(local_e0 + 0x10),1);
  hwnet::util::TimerRoutine::addTimer<testTimerRoutine()::__0>
            ((TimerRoutine *)local_e0,(milliseconds)(local_e0 + 0x10),
             (anon_class_1_0_00000001_for__M_f *)0x64);
  std::weak_ptr<hwnet::util::Timer>::~weak_ptr((weak_ptr<hwnet::util::Timer> *)local_e0);
  hwnet::util::TimerRoutine::addTimer<testTimerRoutine()::__1>
            ((TimerRoutine *)local_108,(milliseconds)(local_e0 + 0x10),
             (anon_class_1_0_00000001_for__M_f *)0xc8);
  std::weak_ptr<hwnet::util::Timer>::~weak_ptr((weak_ptr<hwnet::util::Timer> *)local_108);
  local_11c = 1;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)local_118,&local_11c);
  std::this_thread::sleep_for<long,std::ratio<1l,1l>>(local_118);
  hwnet::util::TimerRoutine::~TimerRoutine((TimerRoutine *)(local_e0 + 0x10));
  return;
}

Assistant:

void testTimerRoutine() {
	hwnet::util::TimerRoutine routine(hwnet::util::TimerMgr::normal);


	routine.addTimer(100,[](const hwnet::util::Timer::Ptr & t){
		std::cout << "timer 100" << std::endl;
	});

	routine.addTimer(200,[](const hwnet::util::Timer::Ptr & t){
		std::cout << "timer 200" << std::endl;
	});	

	std::this_thread::sleep_for(std::chrono::seconds(1));

}